

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedPumpTo::write
          (BlockedPumpTo *this,int __fd,void *__buf,size_t __n)

{
  _func_int **pp_Var1;
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  bool bVar2;
  unsigned_long *puVar3;
  ArrayPtr<const_unsigned_char> *pAVar4;
  Range<unsigned_long> *pRVar5;
  ArrayPtr<const_unsigned_char> *this_00;
  size_t sVar6;
  undefined4 in_register_00000034;
  PromiseFulfiller<kj::AsyncCapabilityStream::ReadResult> *pPVar7;
  ArrayPtr<const_unsigned_char> AVar8;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> AVar9;
  SourceLocation local_250;
  Type local_238;
  Type local_228;
  undefined4 local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  Type local_208;
  Fault local_1f8;
  Fault f_1;
  unsigned_long *local_1e8;
  undefined1 local_1e0 [8];
  DebugComparison<unsigned_long_&,_unsigned_long> _kjCondition_1;
  Promise<void> local_1a0;
  _func_int **local_198;
  AsyncPipe *pipeRef;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> remainder;
  SourceLocation local_178;
  Type local_160;
  Type local_150;
  Canceler local_140 [2];
  SourceLocation local_130;
  Type local_118;
  undefined1 local_108 [16];
  size_t sStack_f8;
  Promise<void> local_f0;
  Canceler local_e8;
  uchar *puStack_e0;
  ArrayPtr<const_unsigned_char> partial2;
  Promise<void> local_b8;
  uchar *puStack_b0;
  ArrayPtr<const_unsigned_char> partial;
  size_t local_98;
  size_t local_88;
  unsigned_long i;
  Iterator __end3;
  Iterator __begin3;
  Range<unsigned_long> *__range3;
  size_t needed;
  size_t size;
  Fault local_38;
  Fault f;
  DebugExpression<bool> _kjCondition;
  BlockedPumpTo *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces_local;
  Promise<void> *promise;
  
  pPVar7 = (PromiseFulfiller<kj::AsyncCapabilityStream::ReadResult> *)
           CONCAT44(in_register_00000034,__fd);
  this_local = (BlockedPumpTo *)__buf;
  pieces_local.ptr = (ArrayPtr<const_unsigned_char> *)__n;
  pieces_local.size_ = (size_t)this;
  f.exception._6_1_ = Canceler::isEmpty((Canceler *)(pPVar7 + 7));
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar2 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (!bVar2) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
              (&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0x4ee,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",
               (DebugExpression<bool> *)((long)&f.exception + 7),(char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal(&local_38);
  }
  needed = 0;
  __range3 = (Range<unsigned_long> *)
             ((long)pPVar7[5].super_PromiseRejector._vptr_PromiseRejector -
             (long)pPVar7[6].super_PromiseRejector._vptr_PromiseRejector);
  ___begin3 = indices<kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>&>
                        ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
  __end3 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin3);
  i = (unsigned_long)Range<unsigned_long>::end((Range<unsigned_long> *)&__begin3);
  while( true ) {
    bVar2 = Range<unsigned_long>::Iterator::operator==(&__end3,(Iterator *)&i);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_1e8 = (unsigned_long *)
                  kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&needed);
      f_1.exception =
           (Exception *)
           ((long)pPVar7[5].super_PromiseRejector._vptr_PromiseRejector -
           (long)pPVar7[6].super_PromiseRejector._vptr_PromiseRejector);
      kj::_::DebugExpression<unsigned_long&>::operator<=
                ((DebugComparison<unsigned_long_&,_unsigned_long> *)local_1e0,
                 (DebugExpression<unsigned_long&> *)&local_1e8,(unsigned_long *)&f_1);
      bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1e0);
      if (bVar2) {
        pp_Var1 = pPVar7[4].super_PromiseRejector._vptr_PromiseRejector;
        local_218 = this_local._0_4_;
        uStack_214 = this_local._4_4_;
        uStack_210 = pieces_local.ptr._0_4_;
        uStack_20c = pieces_local.ptr._4_4_;
        (**(code **)(*pp_Var1 + 8))(&local_208,pp_Var1,this_local,pieces_local.ptr);
        local_228.canceler = (Canceler *)needed;
        local_228.fulfiller = (PromiseFulfiller<unsigned_long> *)pPVar7;
        local_238 = kj::(anonymous_namespace)::AsyncPipe::
                    teeExceptionVoid<kj::PromiseFulfiller<unsigned_long>>
                              ((PromiseFulfiller<unsigned_long> *)
                               pPVar7[2].super_PromiseRejector._vptr_PromiseRejector,
                               (Canceler *)(pPVar7 + 7));
        SourceLocation::SourceLocation
                  (&local_250,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                   ,"write",0x521,0x1c);
        location_01.function = local_250.function;
        location_01.fileName = local_250.fileName;
        location_01.lineNumber = local_250.lineNumber;
        location_01.columnNumber = local_250.columnNumber;
        Promise<void>::
        then<kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_5_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionVoid<kj::PromiseFulfiller<unsigned_long>>(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_>
                  ((Promise<void> *)&local_208.size,&local_208,&local_228,location_01);
        Canceler::wrap<void>((Canceler *)this,(Promise<void> *)(pPVar7 + 7));
        Promise<void>::~Promise((Promise<void> *)&local_208.size);
        Promise<void>::~Promise((Promise<void> *)&local_208);
        return (ssize_t)this;
      }
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long>&>
                (&local_1f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                 ,0x520,FAILED,"size <= amount - pumpedSoFar","_kjCondition,",
                 (DebugComparison<unsigned_long_&,_unsigned_long> *)local_1e0);
      kj::_::Debug::Fault::fatal(&local_1f8);
    }
    puVar3 = Range<unsigned_long>::Iterator::operator*(&__end3);
    local_88 = *puVar3;
    pAVar4 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                       ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,local_88);
    pRVar5 = (Range<unsigned_long> *)ArrayPtr<const_unsigned_char>::size(pAVar4);
    if (__range3 < pRVar5) break;
    pAVar4 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                       ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,local_88);
    sVar6 = ArrayPtr<const_unsigned_char>::size(pAVar4);
    needed = sVar6 + needed;
    pAVar4 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                       ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,local_88);
    sVar6 = ArrayPtr<const_unsigned_char>::size(pAVar4);
    __range3 = (Range<unsigned_long> *)((long)__range3 - sVar6);
    Range<unsigned_long>::Iterator::operator++(&__end3);
  }
  pp_Var1 = pPVar7[4].super_PromiseRejector._vptr_PromiseRejector;
  join_0x00000010_0x00000000_ =
       ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::first
                 ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,local_88);
  (**(code **)(*pp_Var1 + 8))(this,pp_Var1,partial.size_,local_98);
  if (__range3 == (Range<unsigned_long> *)0x0) {
    local_150.fulfiller = (PromiseFulfiller<unsigned_long> *)pPVar7;
    local_160 = kj::(anonymous_namespace)::AsyncPipe::
                teeExceptionVoid<kj::PromiseFulfiller<unsigned_long>>
                          ((PromiseFulfiller<unsigned_long> *)
                           pPVar7[2].super_PromiseRejector._vptr_PromiseRejector,
                           (Canceler *)(pPVar7 + 7));
    SourceLocation::SourceLocation
              (&local_178,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,"write",0x509,0x25);
    location_00.function = local_178.function;
    location_00.fileName = local_178.fileName;
    location_00.lineNumber = local_178.lineNumber;
    location_00.columnNumber = local_178.columnNumber;
    Promise<void>::
    then<kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_3_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionVoid<kj::PromiseFulfiller<unsigned_long>>(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_>
              ((Promise<void> *)&local_150.canceler,(Type *)this,&local_150,location_00);
    Canceler::wrap<void>(local_140,(Promise<void> *)(pPVar7 + 7));
    Promise<void>::operator=((Promise<void> *)this,(Promise<void> *)local_140);
    Promise<void>::~Promise((Promise<void> *)local_140);
    Promise<void>::~Promise((Promise<void> *)&local_150.canceler);
  }
  else {
    pAVar4 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                       ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,local_88);
    AVar8 = ArrayPtr<const_unsigned_char>::first(pAVar4,(size_t)__range3);
    partial.ptr = (uchar *)AVar8.size_;
    puStack_b0 = AVar8.ptr;
    partial2.size_ = (size_t)pPVar7;
    Promise<void>::
    then<kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_1_>
              (&local_b8,(Type *)this);
    Promise<void>::operator=((Promise<void> *)this,&local_b8);
    Promise<void>::~Promise(&local_b8);
    pAVar4 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                       ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,local_88);
    this_00 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                        ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,local_88)
    ;
    sVar6 = ArrayPtr<const_unsigned_char>::size(this_00);
    join_0x00000010_0x00000000_ =
         ArrayPtr<const_unsigned_char>::slice(pAVar4,(size_t)__range3,sVar6);
    partial2.ptr = (uchar *)local_108._16_8_;
    puStack_e0 = local_108._8_8_;
    local_108._0_8_ = pPVar7;
    local_118 = kj::(anonymous_namespace)::AsyncPipe::
                teeExceptionPromise<void,kj::PromiseFulfiller<unsigned_long>>
                          ((PromiseFulfiller<unsigned_long> *)
                           pPVar7[2].super_PromiseRejector._vptr_PromiseRejector,
                           (Canceler *)(pPVar7 + 7));
    SourceLocation::SourceLocation
              (&local_130,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,"write",0x500,0x25);
    location.function = local_130.function;
    location.fileName = local_130.fileName;
    location.lineNumber = local_130.lineNumber;
    location.columnNumber = local_130.columnNumber;
    Promise<void>::
    then<kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_2_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionPromise<void,kj::PromiseFulfiller<unsigned_long>>(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_>
              (&local_f0,(Type *)this,(Type *)local_108,location);
    Canceler::wrap<void>(&local_e8,(Promise<void> *)(pPVar7 + 7));
    Promise<void>::operator=((Promise<void> *)this,(Promise<void> *)&local_e8);
    Promise<void>::~Promise((Promise<void> *)&local_e8);
    Promise<void>::~Promise(&local_f0);
    local_88 = local_88 + 1;
  }
  sVar6 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
  AVar9 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::slice
                    ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,local_88,
                     sVar6);
  remainder.ptr = (ArrayPtr<const_unsigned_char> *)AVar9.size_;
  pipeRef = (AsyncPipe *)AVar9.ptr;
  sVar6 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&pipeRef);
  if (sVar6 == 0) {
    return (ssize_t)this;
  }
  _kjCondition_1._32_8_ = pPVar7[3].super_PromiseRejector._vptr_PromiseRejector;
  local_198 = (_func_int **)_kjCondition_1._32_8_;
  Promise<void>::
  then<kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_4_>
            (&local_1a0,(Type *)this);
  Promise<void>::operator=((Promise<void> *)this,&local_1a0);
  Promise<void>::~Promise(&local_1a0);
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
      KJ_REQUIRE(canceler.isEmpty(), "already pumping");

      size_t size = 0;
      size_t needed = amount - pumpedSoFar;
      for (auto i: kj::indices(pieces)) {
        if (pieces[i].size() > needed) {
          // The pump ends in the middle of this write.

          auto promise = output.write(pieces.first(i));

          if (needed > 0) {
            // The pump includes part of this piece, but not all. Unfortunately we need to split
            // writes.
            auto partial = pieces[i].first(needed);
            promise = promise.then([this,partial]() {
              return output.write(partial);
            });
            auto partial2 = pieces[i].slice(needed, pieces[i].size());
            promise = canceler.wrap(promise.then([this,partial2]() {
              canceler.release();
              fulfiller.fulfill(kj::cp(amount));
              pipe.endState(*this);
              return pipe.write(partial2);
            }, teeExceptionPromise<void>(fulfiller, canceler)));
            ++i;
          } else {
            // The pump ends exactly at the end of a piece, how nice.
            promise = canceler.wrap(promise.then([this]() {
              canceler.release();
              fulfiller.fulfill(kj::cp(amount));
              pipe.endState(*this);
            }, teeExceptionVoid(fulfiller, canceler)));
          }

          auto remainder = pieces.slice(i, pieces.size());
          if (remainder.size() > 0) {
            auto& pipeRef = pipe;
            promise = promise.then([&pipeRef,remainder]() {
              return pipeRef.write(remainder);
            });
          }

          return promise;
        } else {
          size += pieces[i].size();
          needed -= pieces[i].size();
        }
      }

      // Turns out we can forward this whole write.
      KJ_ASSERT(size <= amount - pumpedSoFar);
      return canceler.wrap(output.write(pieces).then([this,size]() {
        pumpedSoFar += size;
        KJ_ASSERT(pumpedSoFar <= amount);
        if (pumpedSoFar == amount) {
          // Done pumping.
          canceler.release();
          fulfiller.fulfill(kj::cp(amount));
          pipe.endState(*this);
        }
      }, teeExceptionVoid(fulfiller, canceler)));
    }